

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_event.hpp
# Opt level: O0

bool __thiscall
oqpi::posix_event<oqpi::posix_event_manual_reset_policy>::waitFor<long,std::ratio<1l,1l>>
          (posix_event<oqpi::posix_event_manual_reset_policy> *this,
          duration<long,_std::ratio<1L,_1L>_> *relTime)

{
  bool bVar1;
  duration<long,_std::ratio<1L,_1L>_> *relTime_local;
  posix_event<oqpi::posix_event_manual_reset_policy> *this_local;
  
  bVar1 = posix_semaphore_wrapper::waitFor<long,std::ratio<1l,1l>>(&this->sem_,relTime);
  if (bVar1) {
    bVar1 = posix_event_manual_reset_policy::is_manual_reset_enabled();
    if (bVar1) {
      posix_semaphore_wrapper::post(&this->sem_);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool waitFor(const std::chrono::duration<_Rep, _Period>& relTime)
        {
            if (!sem_.waitFor(relTime))
            {
                return false;
            }

            // Only if its a manual reset event, then we also want to signal other potential waiters.
            // increment lock. Snowball effect.
            if (_ResetPolicy::is_manual_reset_enabled())
            {
                sem_.post();
            }

            return true;
        }